

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(void)

{
  reference ppbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  reference pvVar3;
  long lVar4;
  ulong uVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  allocator<char> local_344;
  allocator<char> local_343;
  allocator_type local_342;
  allocator<char> local_341;
  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_340;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
  r;
  Table tb;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  Table hp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  Table tab;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&tb,"Name",(allocator<char> *)&hp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &tb.Data.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"Gender",(allocator<char> *)&r);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"Age",(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"DOB",&local_344);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"Height",&local_343);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"Weight",&local_341);
  __l._M_len = 6;
  __l._M_array = (iterator)&tb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_160,__l,&local_342);
  Table::Table(&tab,&local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_160);
  lVar4 = 0xa0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&tb.Columns.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tb,"Funanya Radomir",(allocator<char> *)&hp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &tb.Data.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"Female",(allocator<char> *)&r);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"3",(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"6/1/2015",&local_344);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"3 ft 1 in",&local_343);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"29.5 lbs",&local_341);
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&tb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_178,__l_00,&local_342);
  Table::Insert(&tab,&local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  lVar4 = 0xa0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&tb.Columns.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tb,"Reanna Shekhar",(allocator<char> *)&hp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &tb.Data.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"Female",(allocator<char> *)&r);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"15",(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"10/31/2003",&local_344);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"5 ft 6 in",&local_343);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"130 lbs",&local_341);
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)&tb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_190,__l_01,&local_342);
  Table::Insert(&tab,&local_190);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190);
  lVar4 = 0xa0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&tb.Columns.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  Table::Print(&tab);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Patients.csv",(allocator<char> *)&tb);
  Table::Save(&tab,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tb,"Name",(allocator<char> *)&r);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &tb.Data.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"Stock",(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"RequiresID",&local_344);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&tb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a8,__l_02,(allocator_type *)&local_343);
  Table::Table(&hp,&local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&tb.Columns.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tb,"Ibuprofin",(allocator<char> *)&r);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &tb.Data.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"423,243",(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"False",&local_344);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&tb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c0,__l_03,(allocator_type *)&local_343);
  Table::Insert(&hp,&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&tb.Columns.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tb,"Psuedophedrine",(allocator<char> *)&r);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &tb.Data.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"345,223",(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"True",&local_344);
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&tb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1d8,__l_04,(allocator_type *)&local_343);
  Table::Insert(&hp,&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&tb.Columns.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tb,"Tylenol",(allocator<char> *)&r);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &tb.Data.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"452,334",(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"False",&local_344);
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&tb;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f0,__l_05,(allocator_type *)&local_343);
  Table::Insert(&hp,&local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&tb.Columns.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  Table::Print(&hp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Medications.csv",(allocator<char> *)&tb);
  Table::Save(&hp,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"RequiresID",(allocator<char> *)&tb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"True",(allocator<char> *)&local_340);
  Table::GetRowsWithValue(&r,&hp,&local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)r.
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)r.
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,
             r.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5]);
    PrintVector<std::__cxx11::string>(&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Patients.csv",(allocator<char> *)&local_340);
  Table::Load(&tb,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  Table::Print(&tb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Name",&local_344);
  Table::GetColumn((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                    *)&local_340,&tb,&local_f8);
  ppbVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                  *)&local_340,1);
  std::__cxx11::string::assign((char *)*ppbVar1);
  std::
  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~_Vector_base(&local_340);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Name",(allocator<char> *)&local_340);
  Table::GetColumn((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                    *)&local_208,&tb,&local_118);
  PrintVector<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)&local_208);
  std::
  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~_Vector_base(&local_208);
  std::__cxx11::string::~string((string *)&local_118);
  pvVar2 = Table::GetRow_abi_cxx11_(&tb,0);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(pvVar2,0);
  std::__cxx11::string::assign((char *)pvVar3);
  pvVar2 = Table::GetRow_abi_cxx11_(&tb,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_220,pvVar2);
  PrintVector<std::__cxx11::string>(&local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_220);
  Table::~Table(&tb);
  std::
  _Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
  ::~_Vector_base(&r.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
                 );
  Table::~Table(&hp);
  Table::~Table(&tab);
  return 0;
}

Assistant:

int main() {
	Table tab({"Name", "Gender", "Age", "DOB", "Height", "Weight"});
	tab.Insert({"Funanya Radomir", "Female", "3", "6/1/2015", "3 ft 1 in", "29.5 lbs"});
	tab.Insert({"Reanna Shekhar", "Female", "15", "10/31/2003", "5 ft 6 in", "130 lbs"});
	tab.Print();
	tab.Save("Patients.csv");

	Table hp({"Name", "Stock", "RequiresID"});
	hp.Insert({"Ibuprofin", "423,243", "False"});
	hp.Insert({"Psuedophedrine", "345,223", "True"});
	hp.Insert({"Tylenol", "452,334", "False"});
	hp.Print();
	hp.Save("Medications.csv");

	std::vector< std::vector < std::string >* > r = hp.GetRowsWithValue("RequiresID", "True");
	for (int i = 0; i < r.size(); i++){
		PrintVector(*r[i]);
		std::cout << std::endl;
	}

	Table tb = Table::Load("Patients.csv");
	tb.Print();
	*tb.GetColumn("Name").at(1) = "REDACTED";
	PrintVector<std::string>(tb.GetColumn("Name"));
	tb.GetRow(0)->at(0) = "REDACTED"; // sets the first value in the first row
	PrintVector(*tb.GetRow(0));
}